

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch.c
# Opt level: O2

void * bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,__compar_fn_t __compar)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  
  do {
    while( true ) {
      if (__nmemb == 0) {
        return (void *)0x0;
      }
      uVar3 = __nmemb >> 1;
      pvVar2 = (void *)(uVar3 * __size + (long)__base);
      iVar1 = (*__compar)(__key,pvVar2);
      if (iVar1 < 1) break;
      __base = (void *)((long)pvVar2 + __size);
      __nmemb = uVar3 - (~(uint)__nmemb & 1);
    }
    __nmemb = uVar3;
  } while (iVar1 != 0);
  return pvVar2;
}

Assistant:

void * bsearch( const void * key, const void * base, size_t nmemb, size_t size, int ( *compar )( const void *, const void * ) )
{
    const void * pivot;
    int rc;
    size_t corr;

    while ( nmemb )
    {
        /* algorithm needs -1 correction if remaining elements are an even number. */
        corr = nmemb % 2;
        nmemb /= 2;
        pivot = ( const char * )base + ( nmemb * size );
        rc = compar( key, pivot );

        if ( rc > 0 )
        {
            base = ( const char * )pivot + size;
            /* applying correction */
            nmemb -= ( 1 - corr );
        }
        else if ( rc == 0 )
        {
            return ( void * )pivot;
        }
    }

    return NULL;
}